

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DGXMLScanner::scanDocTypeDecl(DGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  DocTypeHandler *pDVar1;
  XMLCh *pXVar2;
  MemoryManager *manager;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_02;
  Grammar *pGVar3;
  GrammarResolver *this_03;
  XMLValidator *pXVar4;
  XMLStringPool *pXVar5;
  bool bVar6;
  bool bVar7;
  XMLCh XVar8;
  XMLCh XVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  DTDElementDecl *this_04;
  DTDElementDecl *pDVar13;
  XMLSize_t XVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DTDGrammar *pDVar16;
  XMLReader *reader;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DTDEntityDecl *this_05;
  RuntimeException *this_06;
  undefined4 extraout_var_03;
  MemoryManager **ppMVar17;
  byte bVar18;
  InputSource *pIVar19;
  XMLCh *local_110;
  char16_t *local_108;
  bool skippedSomething;
  InputSource *srcUsed;
  DTDElementDecl *local_f0;
  ArrayJanitor<char16_t> janSysId;
  ArrayJanitor<char16_t> janPubId;
  XMLBufBid bbRootName;
  XMLCh gDTDStr [4];
  int colonPosition;
  DTDScanner dtdScanner;
  InputSource *pIVar15;
  
  pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
  if (pDVar1 != (DocTypeHandler *)0x0) {
    (*pDVar1->_vptr_DocTypeHandler[0xc])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  ReaderMgr::skipPastSpaces(this_00,&skippedSomething,false);
  if (skippedSomething == false) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    ReaderMgr::skipPastChar(this_00,L'>');
    return;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  bbRootName.fBuffer = XMLBufferMgr::bidOnBuffer(this_01);
  bbRootName.fMgr = this_01;
  if ((this->super_XMLScanner).fDoNamespaces == true) {
    bVar6 = ReaderMgr::getQName(this_00,bbRootName.fBuffer,&colonPosition);
  }
  else {
    bVar6 = ReaderMgr::getName(this_00,bbRootName.fBuffer);
  }
  if (bVar6 == false) {
    if ((bbRootName.fBuffer)->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,NoRootElemInDOCTYPE);
    }
    else {
      pXVar2 = (bbRootName.fBuffer)->fBuffer;
      pXVar2[(bbRootName.fBuffer)->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidRootElemInDOCTYPE,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipPastChar(this_00,L'>');
    goto LAB_0029fe51;
  }
  pXVar2 = (bbRootName.fBuffer)->fBuffer;
  pXVar2[(bbRootName.fBuffer)->fIndex] = L'\0';
  XMLScanner::setRootElemName(&this->super_XMLScanner,pXVar2);
  ppMVar17 = &(this->super_XMLScanner).fGrammarPoolMemoryManager;
  if ((this->super_XMLScanner).fUseCachedGrammar != false) {
    ppMVar17 = &(this->super_XMLScanner).fMemoryManager;
  }
  manager = *ppMVar17;
  this_04 = (DTDElementDecl *)XMemory::operator_new(0x58,manager);
  pXVar2 = (bbRootName.fBuffer)->fBuffer;
  pXVar2[(bbRootName.fBuffer)->fIndex] = L'\0';
  DTDElementDecl::DTDElementDecl
            (this_04,pXVar2,(this->super_XMLScanner).fEmptyNamespaceId,Any,manager);
  (this_04->super_XMLElementDecl).fCreateReason = AsRootElem;
  (this_04->super_XMLElementDecl).fExternalElement = true;
  local_f0 = this_04;
  if ((this->super_XMLScanner).fUseCachedGrammar == false) {
    pGVar3 = (this->super_XMLScanner).fGrammar;
    (*(pGVar3->super_XSerializable)._vptr_XSerializable[0x11])(pGVar3,this_04,0);
    local_f0 = (DTDElementDecl *)0x0;
  }
  else {
    this_02 = this->fDTDElemNonDeclPool;
    pXVar2 = (bbRootName.fBuffer)->fBuffer;
    pXVar2[(bbRootName.fBuffer)->fIndex] = L'\0';
    pDVar13 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this_02,pXVar2);
    if (pDVar13 == (DTDElementDecl *)0x0) {
      XVar14 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_04);
      local_f0 = (DTDElementDecl *)0x0;
    }
    else {
      XVar14 = (pDVar13->super_XMLElementDecl).fId;
    }
    (this_04->super_XMLElementDecl).fId = XVar14;
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar6 = ReaderMgr::skippedChar(this_00,L'>');
  if (bVar6) {
    pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
    if (pDVar1 != (DocTypeHandler *)0x0) {
      (*pDVar1->_vptr_DocTypeHandler[4])(pDVar1,this_04,0,0,0,0);
    }
  }
  else {
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
    }
    DTDScanner::DTDScanner
              (&dtdScanner,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
               (this->super_XMLScanner).fDocTypeHandler,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo(&dtdScanner,&this->super_XMLScanner,this_00,this_01);
    XVar8 = ReaderMgr::peekNextChar(this_00);
    if (XVar8 == L'[') {
      bVar6 = true;
      local_110 = (char16_t *)0x0;
      local_108 = (char16_t *)0x0;
LAB_0029fa88:
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janSysId,local_110,(this->super_XMLScanner).fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janPubId,local_108,(this->super_XMLScanner).fMemoryManager);
      pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
      if (pDVar1 == (DocTypeHandler *)0x0) {
        bVar18 = 1;
        if (bVar6 != false) goto LAB_0029fb00;
LAB_0029fb65:
        bVar6 = ReaderMgr::skippedChar(this_00,L'>');
        if (!bVar6) {
          bVar6 = ReaderMgr::skippedChar(this_00,L']');
          if ((bVar6) && (bVar6 = ReaderMgr::skippedChar(this_00,L'>'), bVar6)) {
            XMLScanner::emitError(&this->super_XMLScanner,ExtraCloseSquare);
          }
          else {
            XMLScanner::emitError(&this->super_XMLScanner,UnterminatedDOCTYPE);
            ReaderMgr::skipPastChar(this_00,L'>');
          }
        }
        if (XVar8 != L'[') {
          srcUsed = (InputSource *)0x0;
          if ((bVar18 & (this->super_XMLScanner).fUseCachedGrammar) == 1) {
            iVar10 = (*(this->super_XMLScanner).super_XMLBufferFullHandler.
                       _vptr_XMLBufferFullHandler[0x11])(this,local_110,local_108);
            pIVar15 = (InputSource *)CONCAT44(extraout_var,iVar10);
            srcUsed = pIVar15;
            if (pIVar15 == (InputSource *)0x0) goto LAB_0029fc72;
            this_03 = (this->super_XMLScanner).fGrammarResolver;
            iVar10 = (*pIVar15->_vptr_InputSource[5])(pIVar15);
            pDVar16 = (DTDGrammar *)
                      GrammarResolver::getGrammar(this_03,(XMLCh *)CONCAT44(extraout_var_00,iVar10))
            ;
            pIVar19 = pIVar15;
            if ((pDVar16 == (DTDGrammar *)0x0) ||
               (iVar10 = (*(pDVar16->super_Grammar).super_XSerializable._vptr_XSerializable[5])
                                   (pDVar16), iVar10 != 0)) goto LAB_0029fc75;
            this->fDTDGrammar = pDVar16;
            (this->super_XMLScanner).fGrammar = (Grammar *)pDVar16;
            pXVar4 = (this->super_XMLScanner).fValidator;
            (*pXVar4->_vptr_XMLValidator[0xb])(pXVar4,pDVar16);
            pDVar1 = (this->super_XMLScanner).fDocTypeHandler;
            if (pDVar1 != (DocTypeHandler *)0x0) {
              (*pDVar1->_vptr_DocTypeHandler[0x10])();
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[10])();
            }
          }
          else {
LAB_0029fc72:
            pIVar19 = (InputSource *)0x0;
LAB_0029fc75:
            pIVar15 = pIVar19;
            if (((this->super_XMLScanner).fLoadExternalDTD != false) ||
               ((this->super_XMLScanner).fValidate == true)) {
              XVar14 = (this->super_XMLScanner).fLowWaterMark;
              bVar6 = (this->super_XMLScanner).fCalculateSrcOfs;
              if (srcUsed == (InputSource *)0x0) {
                reader = ReaderMgr::createReader
                                   (this_00,local_110,local_108,false,RefFrom_NonLiteral,
                                    Type_General,Source_External,&srcUsed,bVar6,XVar14,
                                    (this->super_XMLScanner).fDisableDefaultEntityResolution);
                pIVar15 = srcUsed;
                if (pIVar19 != (InputSource *)0x0) {
                  (*pIVar19->_vptr_InputSource[1])(pIVar19);
                }
              }
              else {
                reader = ReaderMgr::createReader
                                   (this_00,srcUsed,false,RefFrom_NonLiteral,Type_General,
                                    Source_External,bVar6,XVar14);
              }
              if (reader == (XMLReader *)0x0) {
                this_06 = (RuntimeException *)__cxa_allocate_exception(0x30);
                if (srcUsed != (InputSource *)0x0) {
                  iVar10 = (*srcUsed->_vptr_InputSource[5])();
                  local_110 = (XMLCh *)CONCAT44(extraout_var_03,iVar10);
                }
                RuntimeException::RuntimeException
                          (this_06,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                           ,0x40a,Gen_CouldNotOpenDTD,local_110,(XMLCh *)0x0,(XMLCh *)0x0,
                           (XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
                __cxa_throw(this_06,&RuntimeException::typeinfo,XMLException::~XMLException);
              }
              if ((this->super_XMLScanner).fToCacheGrammar == true) {
                pXVar5 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar10 = (*srcUsed->_vptr_InputSource[5])();
                uVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])
                                   (pXVar5,CONCAT44(extraout_var_01,iVar10));
                pXVar5 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar10 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])
                                   (pXVar5,(ulong)uVar11);
                GrammarResolver::orphanGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (XMLCh *)XMLUni::fgDTDEntityString);
                iVar12 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable).
                           _vptr_XSerializable[0x16])();
                (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar12) + 0x50))
                          ((long *)CONCAT44(extraout_var_02,iVar12),iVar10);
                GrammarResolver::putGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (this->super_XMLScanner).fGrammar);
              }
              builtin_memcpy(gDTDStr,L"DTD",8);
              this_05 = (DTDEntityDecl *)
                        XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
              DTDEntityDecl::DTDEntityDecl
                        (this_05,gDTDStr,false,(this->super_XMLScanner).fMemoryManager);
              XMLEntityDecl::setSystemId((XMLEntityDecl *)this_05,local_110);
              (this_05->super_XMLEntityDecl).fIsExternal = true;
              reader->fThrowAtEnd = true;
              ReaderMgr::pushReaderAdoptEntity(this_00,reader,(XMLEntityDecl *)this_05,true);
              DTDScanner::scanExtSubsetDecl(&dtdScanner,false,true);
            }
            if (pIVar15 == (InputSource *)0x0) goto LAB_0029fe23;
          }
          (*pIVar15->_vptr_InputSource[1])(pIVar15);
        }
      }
      else {
        (*pDVar1->_vptr_DocTypeHandler[4])
                  (pDVar1,this_04,local_108,local_110,(ulong)bVar6,(ulong)(XVar8 != L'['));
        bVar18 = 1;
        if (bVar6 == false) goto LAB_0029fb65;
LAB_0029fb00:
        ReaderMgr::getNextChar(this_00);
        XMLScanner::checkInternalDTD(&this->super_XMLScanner,XVar8 != L'[',local_110,local_108);
        bVar6 = DTDScanner::scanInternalSubset(&dtdScanner);
        if (bVar6) {
          XVar14 = ReaderMgr::getReaderDepth(this_00);
          if (1 < XVar14) {
            XMLScanner::emitError(&this->super_XMLScanner,PEPropogated);
            ReaderMgr::cleanStackBackTo(this_00,1);
          }
          ReaderMgr::skipPastSpaces(this_00);
          bVar18 = 0;
          goto LAB_0029fb65;
        }
        ReaderMgr::skipPastChar(this_00,L'>');
      }
LAB_0029fe23:
      ArrayJanitor<char16_t>::~ArrayJanitor(&janPubId);
      ArrayJanitor<char16_t>::~ArrayJanitor(&janSysId);
    }
    else {
      (this->super_XMLScanner).fHasNoDTD = false;
      janSysId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janSysId.fMemoryManager = (MemoryManager *)this_01;
      janPubId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janPubId.fMemoryManager = (MemoryManager *)this_01;
      bVar7 = DTDScanner::scanId(&dtdScanner,(XMLBuffer *)janSysId.fData,(XMLBuffer *)janPubId.fData
                                 ,IDType_External);
      if (bVar7) {
        pXVar2 = *(XMLCh **)(janSysId.fData + 0x18);
        pXVar2[*(long *)janSysId.fData] = L'\0';
        local_108 = XMLString::replicate(pXVar2,(this->super_XMLScanner).fMemoryManager);
        pXVar2 = *(XMLCh **)(janPubId.fData + 0x18);
        pXVar2[*(long *)janPubId.fData] = L'\0';
        local_110 = XMLString::replicate(pXVar2,(this->super_XMLScanner).fMemoryManager);
        ReaderMgr::skipPastSpaces(this_00);
        XVar9 = ReaderMgr::peekNextChar(this_00);
        bVar6 = XVar9 == L'[';
      }
      else {
        ReaderMgr::skipPastChar(this_00,L'>');
        local_110 = (XMLCh *)0x0;
        local_108 = (XMLCh *)0x0;
        bVar6 = false;
      }
      XMLBufBid::~XMLBufBid((XMLBufBid *)&janPubId);
      XMLBufBid::~XMLBufBid((XMLBufBid *)&janSysId);
      if (bVar7) goto LAB_0029fa88;
    }
    DTDScanner::~DTDScanner(&dtdScanner);
  }
  if (local_f0 != (DTDElementDecl *)0x0) {
    (*(local_f0->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])();
  }
LAB_0029fe51:
  XMLBufBid::~XMLBufBid(&bbRootName);
  return;
}

Assistant:

void DGXMLScanner::scanDocTypeDecl()
{
    if (fDocTypeHandler)
        fDocTypeHandler->resetDocType();

    // There must be some space after DOCTYPE
    bool skippedSomething;
    fReaderMgr.skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        emitError(XMLErrs::ExpectedWhitespace);

        // Just skip the Doctype declaration and return
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Get a buffer for the root element
    XMLBufBid bbRootName(&fBufMgr);

    //  Get a name from the input, which should be the name of the root
    //  element of the upcoming content.
    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbRootName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbRootName.getBuffer());
    if (!validName)
    {
        if (bbRootName.isEmpty())
            emitError(XMLErrs::NoRootElemInDOCTYPE);
        else
            emitError(XMLErrs::InvalidRootElemInDOCTYPE, bbRootName.getRawBuffer());
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    //  Store the root element name for later check
    setRootElemName(bbRootName.getRawBuffer());

    //  This element obviously is not going to exist in the element decl
    //  pool yet, but we need to call docTypeDecl. So force it into
    //  the element decl pool, marked as being there because it was in
    //  the DOCTYPE. Later, when its declared, the status will be updated.
    //
    //  Only do this if we are not reusing the validator! If we are reusing,
    //  then look it up instead. It has to exist!
    MemoryManager* const  rootDeclMgr =
        fUseCachedGrammar ? fMemoryManager : fGrammarPoolMemoryManager;

    DTDElementDecl* rootDecl = new (rootDeclMgr) DTDElementDecl
    (
        bbRootName.getRawBuffer()
        , fEmptyNamespaceId
        , DTDElementDecl::Any
        , rootDeclMgr
    );

    Janitor<DTDElementDecl> rootDeclJanitor(rootDecl);
    rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
    rootDecl->setExternalElemDeclaration(true);
    if(!fUseCachedGrammar)
    {
        fGrammar->putElemDecl(rootDecl);
        rootDeclJanitor.release();
    } else
    {
        // put this in the undeclared pool so it gets deleted...
        XMLElementDecl* elemDecl = fDTDElemNonDeclPool->getByKey(bbRootName.getRawBuffer());
        if (elemDecl)
        {
            rootDecl->setId(elemDecl->getId());
        }
        else
        {
            rootDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)rootDecl));
            rootDeclJanitor.release();
        }
    }

    // Skip any spaces after the name
    fReaderMgr.skipPastSpaces();

    //  And now if we are looking at a >, then we are done. It is not
    //  required to have an internal or external subset, though why you
    //  would not escapes me.
    if (fReaderMgr.skippedChar(chCloseAngle)) {

        //  If we have a doc type handler and advanced callbacks are enabled,
        //  call the doctype event.
        if (fDocTypeHandler)
            fDocTypeHandler->doctypeDecl(*rootDecl, 0, 0, false);
        return;
    }

    // either internal/external subset
    if (fValScheme == Val_Auto && !fValidate)
        fValidate = true;

    bool    hasIntSubset = false;
    bool    hasExtSubset = false;
    XMLCh*  sysId = 0;
    XMLCh*  pubId = 0;

    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    //  If the next character is '[' then we have no external subset cause
    //  there is no system id, just the opening character of the internal
    //  subset. Else, has to be an id.
    //
    // Just look at the next char, don't eat it.
    if (fReaderMgr.peekNextChar() == chOpenSquare)
    {
        hasIntSubset = true;
    }
    else
    {
        // Indicate we have an external subset
        hasExtSubset = true;
        fHasNoDTD = false;

        // Get buffers for the ids
        XMLBufBid bbPubId(&fBufMgr);
        XMLBufBid bbSysId(&fBufMgr);

        // Get the external subset id
        if (!dtdScanner.scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), DTDScanner::IDType_External))
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // Get copies of the ids we got
        pubId = XMLString::replicate(bbPubId.getRawBuffer(), fMemoryManager);
        sysId = XMLString::replicate(bbSysId.getRawBuffer(), fMemoryManager);

        // Skip spaces and check again for the opening of an internal subset
        fReaderMgr.skipPastSpaces();

        // Just look at the next char, don't eat it.
        if (fReaderMgr.peekNextChar() == chOpenSquare) {
            hasIntSubset = true;
        }
    }

    // Insure that the ids get cleaned up, if they got allocated
    ArrayJanitor<XMLCh> janSysId(sysId, fMemoryManager);
    ArrayJanitor<XMLCh> janPubId(pubId, fMemoryManager);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler)
        fDocTypeHandler->doctypeDecl(*rootDecl, pubId, sysId, hasIntSubset, hasExtSubset);

    //  Ok, if we had an internal subset, we are just past the [ character
    //  and need to parse that first.
    if (hasIntSubset)
    {
        // Eat the opening square bracket
        fReaderMgr.getNextChar();

        checkInternalDTD(hasExtSubset, sysId, pubId);

        //  And try to scan the internal subset. If we fail, try to recover
        //  by skipping forward tot he close angle and returning.
        if (!dtdScanner.scanInternalSubset())
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        //  Do a sanity check that some expanded PE did not propogate out of
        //  the doctype. This could happen if it was terminated early by bad
        //  syntax.
        if (fReaderMgr.getReaderDepth() > 1)
        {
            emitError(XMLErrs::PEPropogated);

            // Ask the reader manager to pop back down to the main level
            fReaderMgr.cleanStackBackTo(1);
        }

        fReaderMgr.skipPastSpaces();
    }

    // And that should leave us at the closing > of the DOCTYPE line
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        //  Do a special check for the common scenario of an extra ] char at
        //  the end. This is easy to recover from.
        if (fReaderMgr.skippedChar(chCloseSquare)
        &&  fReaderMgr.skippedChar(chCloseAngle))
        {
            emitError(XMLErrs::ExtraCloseSquare);
        }
         else
        {
            emitError(XMLErrs::UnterminatedDOCTYPE);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }

    //  If we had an external subset, then we need to deal with that one
    //  next. If we are reusing the validator, then don't scan it.
    if (hasExtSubset) {

        InputSource* srcUsed=0;
        Janitor<InputSource> janSrc(srcUsed);
        // If we had an internal subset and we're using the cached grammar, it
        // means that the ignoreCachedDTD is set, so we ignore the cached
        // grammar
        if (fUseCachedGrammar && !hasIntSubset)
        {
            srcUsed = resolveSystemId(sysId, pubId);
            if (srcUsed) {
                janSrc.reset(srcUsed);
                Grammar* grammar = fGrammarResolver->getGrammar(srcUsed->getSystemId());

                if (grammar && grammar->getGrammarType() == Grammar::DTDGrammarType) {

                    fDTDGrammar = (DTDGrammar*) grammar;
                    fGrammar = fDTDGrammar;
                    fValidator->setGrammar(fGrammar);
                    // If we don't report at least the external subset boundaries,
                    // an advanced document handler cannot know when the DTD end,
                    // since we've already sent a doctype decl that indicates there's
                    // there's an external subset.
                    if (fDocTypeHandler)
                    {
                        fDocTypeHandler->startExtSubset();
                        fDocTypeHandler->endExtSubset();
                    }

                    return;
                }
            }
        }

        if (fLoadExternalDTD || fValidate)
        {
            // And now create a reader to read this entity
            XMLReader* reader;
            if(srcUsed) {
                reader = fReaderMgr.createReader
                        (
                            *srcUsed
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , fCalculateSrcOfs
                            , fLowWaterMark
                        );
            }
            else {
                reader = fReaderMgr.createReader
                        (
                            sysId
                            , pubId
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , srcUsed
                            , fCalculateSrcOfs
                            , fLowWaterMark
                            , fDisableDefaultEntityResolution
                        );
                janSrc.reset(srcUsed);
            }
            //  If it failed then throw an exception
            if (!reader)
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenDTD, srcUsed ? srcUsed->getSystemId() : sysId, fMemoryManager);

            if (fToCacheGrammar) {

                unsigned int stringId = fGrammarResolver->getStringPool()->addOrFind(srcUsed->getSystemId());
                const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(stringId);

                fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
                ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
                fGrammarResolver->putGrammar(fGrammar);
            }

            //  In order to make the processing work consistently, we have to
            //  make this look like an external entity. So create an entity
            //  decl and fill it in and push it with the reader, as happens
            //  with an external entity. Put a janitor on it to insure it gets
            //  cleaned up. The reader manager does not adopt them.
            const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
            DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
            declDTD->setSystemId(sysId);
            declDTD->setIsExternal(true);

            // Mark this one as a throw at end
            reader->setThrowAtEnd(true);

            // And push it onto the stack, with its pseudo name
            fReaderMgr.pushReaderAdoptEntity(reader, declDTD);

            // Tell it its not in an include section
            dtdScanner.scanExtSubsetDecl(false, true);
        }
    }
}